

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Cluster::CreateBlock
          (Cluster *this,longlong id,longlong pos,longlong size,longlong discard_padding)

{
  BlockEntry **ppBVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  BlockEntry **ppBVar6;
  ulong uVar7;
  BlockEntry **local_60;
  BlockEntry **dst;
  BlockEntry **src_end;
  BlockEntry **src;
  BlockEntry **entries;
  long entries_size;
  longlong discard_padding_local;
  longlong size_local;
  longlong pos_local;
  longlong id_local;
  Cluster *this_local;
  
  if ((id == 0xa0) || (id == 0xa3)) {
    if (this->m_entries_count < 0) {
      if (this->m_entries != (BlockEntry **)0x0) {
        __assert_fail("m_entries == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1be6,
                      "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                     );
      }
      if (this->m_entries_size != 0) {
        __assert_fail("m_entries_size == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1be7,
                      "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                     );
      }
      this->m_entries_size = 0x400;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = this->m_entries_size;
      uVar5 = SUB168(auVar3 * ZEXT816(8),0);
      if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      ppBVar6 = (BlockEntry **)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
      this->m_entries = ppBVar6;
      if (this->m_entries == (BlockEntry **)0x0) {
        return -1;
      }
      this->m_entries_count = 0;
    }
    else {
      if (this->m_entries == (BlockEntry **)0x0) {
        __assert_fail("m_entries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1bf0,
                      "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                     );
      }
      if (this->m_entries_size < 1) {
        __assert_fail("m_entries_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1bf1,
                      "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                     );
      }
      if (this->m_entries_size < this->m_entries_count) {
        __assert_fail("m_entries_count <= m_entries_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1bf2,
                      "long mkvparser::Cluster::CreateBlock(long long, long long, long long, long long)"
                     );
      }
      if (this->m_entries_size <= this->m_entries_count) {
        uVar5 = this->m_entries_size << 1;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar5;
        uVar7 = SUB168(auVar4 * ZEXT816(8),0);
        if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
          uVar7 = 0xffffffffffffffff;
        }
        ppBVar6 = (BlockEntry **)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
        if (ppBVar6 == (BlockEntry **)0x0) {
          return -1;
        }
        ppBVar1 = this->m_entries;
        lVar2 = this->m_entries_count;
        local_60 = ppBVar6;
        src_end = ppBVar1;
        while (src_end != ppBVar1 + lVar2) {
          *local_60 = *src_end;
          local_60 = local_60 + 1;
          src_end = src_end + 1;
        }
        if (this->m_entries != (BlockEntry **)0x0) {
          operator_delete__(this->m_entries);
        }
        this->m_entries = ppBVar6;
        this->m_entries_size = uVar5;
      }
    }
    if (id == 0xa0) {
      this_local = (Cluster *)CreateBlockGroup(this,pos,size,discard_padding);
    }
    else {
      this_local = (Cluster *)CreateSimpleBlock(this,pos,size);
    }
  }
  else {
    this_local = (Cluster *)0xffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

long Cluster::CreateBlock(long long id,
                          long long pos,  // absolute pos of payload
                          long long size, long long discard_padding) {
  if (id != libwebm::kMkvBlockGroup && id != libwebm::kMkvSimpleBlock)
    return E_PARSE_FAILED;

  if (m_entries_count < 0) {  // haven't parsed anything yet
    assert(m_entries == NULL);
    assert(m_entries_size == 0);

    m_entries_size = 1024;
    m_entries = new (std::nothrow) BlockEntry*[m_entries_size];
    if (m_entries == NULL)
      return -1;

    m_entries_count = 0;
  } else {
    assert(m_entries);
    assert(m_entries_size > 0);
    assert(m_entries_count <= m_entries_size);

    if (m_entries_count >= m_entries_size) {
      const long entries_size = 2 * m_entries_size;

      BlockEntry** const entries = new (std::nothrow) BlockEntry*[entries_size];
      if (entries == NULL)
        return -1;

      BlockEntry** src = m_entries;
      BlockEntry** const src_end = src + m_entries_count;

      BlockEntry** dst = entries;

      while (src != src_end)
        *dst++ = *src++;

      delete[] m_entries;

      m_entries = entries;
      m_entries_size = entries_size;
    }
  }

  if (id == libwebm::kMkvBlockGroup)
    return CreateBlockGroup(pos, size, discard_padding);
  else
    return CreateSimpleBlock(pos, size);
}